

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O2

void finish(mf *o)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&o->all->pairs,&o->pairs);
  v_array<unsigned_char>::delete_v(&o->indices);
  v_array<float>::delete_v(&o->sub_predictions);
  return;
}

Assistant:

void finish(mf& o)
{
  // restore global pairs
  o.all->pairs = o.pairs;

  // clean up local v_arrays
  o.indices.delete_v();
  o.sub_predictions.delete_v();
}